

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O3

void __thiscall
iu_UnitStringTest_x_iutest_x_ToHexString_Test::Body
          (iu_UnitStringTest_x_iutest_x_ToHexString_Test *this)

{
  size_t sVar1;
  AssertionResult iutest_ar;
  string r;
  type **in_stack_fffffffffffffc98;
  AssertionResult local_360;
  AssertionHelper local_338;
  undefined1 local_308 [392];
  undefined1 *local_180;
  undefined8 local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  long *local_160 [2];
  long local_150 [2];
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  long *local_100 [2];
  long local_f0 [2];
  long *local_e0 [2];
  long local_d0 [2];
  long *local_c0 [2];
  long local_b0 [2];
  long *local_a0 [2];
  long local_90 [2];
  long *local_80 [2];
  long local_70 [2];
  string local_60;
  string local_40;
  
  local_308._0_3_ = 0x3030;
  local_80[0] = local_70;
  sVar1 = strlen(local_308);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,local_308,local_308 + sVar1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_360,(internal *)"\"00\"","::iutest::detail::ToHexString< ::iutest::UInt8 >(0)",
             "00",(char *)local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc98);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  if (local_360.m_result == false) {
    memset((iu_global_format_stringstream *)local_308,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_308);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,local_360.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc9f);
    local_338.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_338.m_part_result.super_iuCodeMessage.m_line = 0xc6;
    local_338.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_338,(Fixed *)local_308,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_338.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_338.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_308);
    std::ios_base::~ios_base((ios_base *)(local_308 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.m_message._M_dataplus._M_p != &local_360.m_message.field_2) {
    operator_delete(local_360.m_message._M_dataplus._M_p,
                    local_360.m_message.field_2._M_allocated_capacity + 1);
  }
  local_308._0_5_ = 0x30303030;
  local_a0[0] = local_90;
  sVar1 = strlen(local_308);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,local_308,local_308 + sVar1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_360,(internal *)"\"0000\"",
             "::iutest::detail::ToHexString< ::iutest::UInt16 >(0)","0000",(char *)local_a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc98);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  if (local_360.m_result == false) {
    memset((iu_global_format_stringstream *)local_308,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_308);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,local_360.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc9f);
    local_338.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_338.m_part_result.super_iuCodeMessage.m_line = 199;
    local_338.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_338,(Fixed *)local_308,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_338.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_338.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_308);
    std::ios_base::~ios_base((ios_base *)(local_308 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.m_message._M_dataplus._M_p != &local_360.m_message.field_2) {
    operator_delete(local_360.m_message._M_dataplus._M_p,
                    local_360.m_message.field_2._M_allocated_capacity + 1);
  }
  local_308._0_8_ = 0x3030303030303030;
  local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
  local_c0[0] = local_b0;
  sVar1 = strlen(local_308);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,local_308,local_308 + sVar1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_360,(internal *)"\"00000000\"",
             "::iutest::detail::ToHexString< ::iutest::UInt32 >(0)","00000000",(char *)local_c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc98);
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  if (local_360.m_result == false) {
    memset((iu_global_format_stringstream *)local_308,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_308);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,local_360.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc9f);
    local_338.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_338.m_part_result.super_iuCodeMessage.m_line = 200;
    local_338.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_338,(Fixed *)local_308,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_338.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_338.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_308);
    std::ios_base::~ios_base((ios_base *)(local_308 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.m_message._M_dataplus._M_p != &local_360.m_message.field_2) {
    operator_delete(local_360.m_message._M_dataplus._M_p,
                    local_360.m_message.field_2._M_allocated_capacity + 1);
  }
  local_308[0] = '0';
  local_308[1] = '0';
  local_308[2] = '0';
  local_308[3] = '0';
  local_308[4] = '0';
  local_308[5] = '0';
  local_308[6] = '0';
  local_308[7] = '0';
  local_308[8] = '0';
  local_308[9] = '0';
  local_308[10] = '0';
  local_308[0xb] = '0';
  local_308[0xc] = '0';
  local_308[0xd] = '0';
  local_308[0xe] = '0';
  local_308[0xf] = '0';
  local_308[0x10] = 0;
  local_e0[0] = local_d0;
  sVar1 = strlen(local_308);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,local_308,local_308 + sVar1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_360,(internal *)"\"0000000000000000\"",
             "::iutest::detail::ToHexString< ::iutest::UInt64 >(0)","0000000000000000",
             (char *)local_e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc98);
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  if (local_360.m_result == false) {
    memset((iu_global_format_stringstream *)local_308,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_308);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,local_360.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc9f);
    local_338.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_338.m_part_result.super_iuCodeMessage.m_line = 0xc9;
    local_338.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_338,(Fixed *)local_308,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_338.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_338.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_308);
    std::ios_base::~ios_base((ios_base *)(local_308 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.m_message._M_dataplus._M_p != &local_360.m_message.field_2) {
    operator_delete(local_360.m_message._M_dataplus._M_p,
                    local_360.m_message.field_2._M_allocated_capacity + 1);
  }
  local_308[0] = 'F';
  local_308[1] = 'F';
  local_308[2] = 'F';
  local_308[3] = 'F';
  local_308[4] = 'F';
  local_308[5] = 'F';
  local_308[6] = 'F';
  local_308[7] = 'F';
  local_308[8] = 'F';
  local_308[9] = 'F';
  local_308[10] = 'F';
  local_308[0xb] = 'F';
  local_308[0xc] = 'F';
  local_308[0xd] = 'F';
  local_308[0xe] = 'F';
  local_308[0xf] = 'F';
  local_308[0x10] = 0;
  local_100[0] = local_f0;
  sVar1 = strlen(local_308);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,local_308,local_308 + sVar1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_360,(internal *)"\"FFFFFFFFFFFFFFFF\"",
             "::iutest::detail::ToHexString< ::iutest::Int64 >(-1)","FFFFFFFFFFFFFFFF",
             (char *)local_100,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc98);
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  if (local_360.m_result == false) {
    memset((iu_global_format_stringstream *)local_308,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_308);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,local_360.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc9f);
    local_338.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_338.m_part_result.super_iuCodeMessage.m_line = 0xca;
    local_338.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_338,(Fixed *)local_308,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_338.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_338.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_308);
    std::ios_base::~ios_base((ios_base *)(local_308 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.m_message._M_dataplus._M_p != &local_360.m_message.field_2) {
    operator_delete(local_360.m_message._M_dataplus._M_p,
                    local_360.m_message.field_2._M_allocated_capacity + 1);
  }
  local_308[0] = '7';
  local_308[1] = 'F';
  local_308[2] = 'F';
  local_308[3] = 'F';
  local_308[4] = 'F';
  local_308[5] = 'F';
  local_308[6] = 'F';
  local_308[7] = 'F';
  local_308[8] = 'F';
  local_308[9] = 'F';
  local_308[10] = 'F';
  local_308[0xb] = 'F';
  local_308[0xc] = 'F';
  local_308[0xd] = 'F';
  local_308[0xe] = 'F';
  local_308[0xf] = 'F';
  local_308[0x10] = 0;
  local_120[0] = local_110;
  sVar1 = strlen(local_308);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,local_308,local_308 + sVar1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_360,(internal *)"\"7FFFFFFFFFFFFFFF\"",
             "::iutest::detail::ToHexString< ::iutest::Int64 >((9223372036854775807L))",
             "7FFFFFFFFFFFFFFF",(char *)local_120,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc98);
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  if (local_360.m_result == false) {
    memset((iu_global_format_stringstream *)local_308,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_308);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,local_360.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc9f);
    local_338.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_338.m_part_result.super_iuCodeMessage.m_line = 0xcc;
    local_338.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_338,(Fixed *)local_308,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_338.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_338.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_308);
    std::ios_base::~ios_base((ios_base *)(local_308 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.m_message._M_dataplus._M_p != &local_360.m_message.field_2) {
    operator_delete(local_360.m_message._M_dataplus._M_p,
                    local_360.m_message.field_2._M_allocated_capacity + 1);
  }
  local_308[0] = '8';
  local_308[1] = '0';
  local_308[2] = '0';
  local_308[3] = '0';
  local_308[4] = '0';
  local_308[5] = '0';
  local_308[6] = '0';
  local_308[7] = '0';
  local_308[8] = '0';
  local_308[9] = '0';
  local_308[10] = '0';
  local_308[0xb] = '0';
  local_308[0xc] = '0';
  local_308[0xd] = '0';
  local_308[0xe] = '0';
  local_308[0xf] = '0';
  local_308[0x10] = 0;
  local_140[0] = local_130;
  sVar1 = strlen(local_308);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,local_308,local_308 + sVar1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_360,(internal *)"\"8000000000000000\"",
             "::iutest::detail::ToHexString< ::iutest::Int64 >((-9223372036854775807L-1))",
             "8000000000000000",(char *)local_140,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc98);
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_360.m_result == false) {
    memset((iu_global_format_stringstream *)local_308,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_308);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,local_360.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc9f);
    local_338.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_338.m_part_result.super_iuCodeMessage.m_line = 0xcd;
    local_338.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_338,(Fixed *)local_308,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_338.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_338.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_308);
    std::ios_base::~ios_base((ios_base *)(local_308 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.m_message._M_dataplus._M_p != &local_360.m_message.field_2) {
    operator_delete(local_360.m_message._M_dataplus._M_p,
                    local_360.m_message.field_2._M_allocated_capacity + 1);
  }
  local_308._0_8_ = 0x3736353433323130;
  local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
  local_160[0] = local_150;
  sVar1 = strlen(local_308);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,local_308,local_308 + sVar1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_360,(internal *)"\"01234567\"","::iutest::detail::ToHexString(0x01234567u)",
             "01234567",(char *)local_160,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc98);
  if (local_160[0] != local_150) {
    operator_delete(local_160[0],local_150[0] + 1);
  }
  if (local_360.m_result == false) {
    memset((iu_global_format_stringstream *)local_308,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_308);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,local_360.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc9f);
    local_338.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_338.m_part_result.super_iuCodeMessage.m_line = 0xcf;
    local_338.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_338,(Fixed *)local_308,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_338.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_338.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_308);
    std::ios_base::~ios_base((ios_base *)(local_308 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.m_message._M_dataplus._M_p != &local_360.m_message.field_2) {
    operator_delete(local_360.m_message._M_dataplus._M_p,
                    local_360.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::ToHexString<char>(&local_40,"ABC",-1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_360,(internal *)"\"414243\"","::iutest::detail::ToHexString(\"ABC\", -1)",
             "414243",(char *)&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_360.m_result == false) {
    memset((iu_global_format_stringstream *)local_308,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_308);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,local_360.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc9f);
    local_338.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_338.m_part_result.super_iuCodeMessage.m_line = 0xd0;
    local_338.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_338,(Fixed *)local_308,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_338.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_338.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_308);
    std::ios_base::~ios_base((ios_base *)(local_308 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.m_message._M_dataplus._M_p != &local_360.m_message.field_2) {
    operator_delete(local_360.m_message._M_dataplus._M_p,
                    local_360.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::ToHexString<char>(&local_60,"ABC",2);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_360,(internal *)"\"4142\"","::iutest::detail::ToHexString(\"ABC\", 2)","4142",
             (char *)&local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_360.m_result == false) {
    memset((iu_global_format_stringstream *)local_308,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_308);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,local_360.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc9f);
    local_338.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_338.m_part_result.super_iuCodeMessage.m_line = 0xd1;
    local_338.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_338,(Fixed *)local_308,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_338.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_338.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_308);
    std::ios_base::~ios_base((ios_base *)(local_308 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.m_message._M_dataplus._M_p != &local_360.m_message.field_2) {
    operator_delete(local_360.m_message._M_dataplus._M_p,
                    local_360.m_message.field_2._M_allocated_capacity + 1);
  }
  local_178 = 0;
  local_170 = 0;
  local_180 = &local_170;
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_360,(internal *)"\"\"","::iutest::detail::ToHexString(\"ABC\", 0)","",
             (char *)&local_180,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc98);
  if (local_180 != &local_170) {
    operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
  }
  if (local_360.m_result == false) {
    memset((iu_global_format_stringstream *)local_308,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_308);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,local_360.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc9f);
    local_338.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_338.m_part_result.super_iuCodeMessage.m_line = 0xd2;
    local_338.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_338,(Fixed *)local_308,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_338.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_338.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_338.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_308);
    std::ios_base::~ios_base((ios_base *)(local_308 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.m_message._M_dataplus._M_p != &local_360.m_message.field_2) {
    operator_delete(local_360.m_message._M_dataplus._M_p,
                    local_360.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, ToHexString)
{
    IUTEST_EXPECT_STREQ(              "00", ::iutest::detail::ToHexString< ::iutest::UInt8  >(0));
    IUTEST_EXPECT_STREQ(            "0000", ::iutest::detail::ToHexString< ::iutest::UInt16 >(0));
    IUTEST_EXPECT_STREQ(        "00000000", ::iutest::detail::ToHexString< ::iutest::UInt32 >(0));
    IUTEST_EXPECT_STREQ("0000000000000000", ::iutest::detail::ToHexString< ::iutest::UInt64 >(0));
    IUTEST_EXPECT_STREQ("FFFFFFFFFFFFFFFF", ::iutest::detail::ToHexString< ::iutest::Int64 >(-1));
#if defined(INT64_MAX)
    IUTEST_EXPECT_STREQ("7FFFFFFFFFFFFFFF", ::iutest::detail::ToHexString< ::iutest::Int64 >(INT64_MAX));
    IUTEST_EXPECT_STREQ("8000000000000000", ::iutest::detail::ToHexString< ::iutest::Int64 >(INT64_MIN));
#endif
    IUTEST_EXPECT_STREQ(        "01234567", ::iutest::detail::ToHexString(0x01234567u));
    IUTEST_EXPECT_STREQ(          "414243", ::iutest::detail::ToHexString("ABC", -1));
    IUTEST_EXPECT_STREQ(            "4142", ::iutest::detail::ToHexString("ABC", 2));
    IUTEST_EXPECT_STREQ(                "", ::iutest::detail::ToHexString("ABC", 0));
}